

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void CompareTableFieldValue<double>(Table *table,int voffset,double val)

{
  double expval;
  
  expval = 0.0;
  if (((ushort)voffset < *(ushort *)(table + -(long)*(int *)table)) &&
     ((ulong)*(ushort *)(table + (((ulong)(uint)voffset & 0xffff) - (long)*(int *)table)) != 0)) {
    expval = *(double *)
              (table + *(ushort *)(table + (((ulong)(uint)voffset & 0xffff) - (long)*(int *)table)))
    ;
  }
  TestEq<double,double>
            (expval,val,"read",
             "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/tests/test.cpp"
             ,0xb4);
  return;
}

Assistant:

void CompareTableFieldValue(flatbuffers::Table *table,
                                                 int voffset, T val) {
  T read = table->GetField(voffset, static_cast<T>(0));
  TEST_EQ(read, val);
}